

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Custom.h
# Opt level: O3

void __thiscall
Iir::Custom::SOSCascade<1,_Iir::DirectFormI>::SOSCascade
          (SOSCascade<1,_Iir::DirectFormI> *this,double (*sosCoefficients) [1] [6])

{
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_stages[0].m_a0 = 1.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_stages[0].m_a1 = 0.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_stages[0].m_a2 = 0.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_stages[0].m_b1 = 0.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_stages[0].m_b2 = 0.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_stages[0].m_b0 = 1.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_states[0].m_x2 = 0.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_states[0].m_y2 = 0.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_states[0].m_x1 = 0.0;
  (this->super_CascadeStages<1,_Iir::DirectFormI>).m_states[0].m_y1 = 0.0;
  Biquad::setCoefficients
            ((Biquad *)this,(*sosCoefficients)[0][3],(*sosCoefficients)[0][4],
             (*sosCoefficients)[0][5],(*sosCoefficients)[0][0],(*sosCoefficients)[0][1],
             (*sosCoefficients)[0][2]);
  return;
}

Assistant:

SOSCascade(const double (&sosCoefficients)[NSOS][6]) {
		CascadeStages<NSOS,StateType>::setup(sosCoefficients);
	}